

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O1

void __thiscall Zippy::ZipArchive::DeleteEntry(ZipArchive *this,string *name)

{
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  __first;
  logic_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->m_IsOpen != false) {
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<Zippy::Impl::ZipEntry*,std::vector<Zippy::Impl::ZipEntry,std::allocator<Zippy::Impl::ZipEntry>>>,__gnu_cxx::__ops::_Iter_pred<Zippy::ZipArchive::DeleteEntry(std::__cxx11::string_const&)::_lambda(Zippy::Impl::ZipEntry_const&)_1_>>
                        ((this->m_ZipEntries).
                         super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->m_ZipEntries).
                         super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MW55[P]DNA_Aeon_cpp_src_______Zippy_library_Zippy_ZipArchive_hpp:517:85)>
                          )name);
    std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::_M_erase
              (&this->m_ZipEntries,(iterator)__first._M_current,
               (this->m_ZipEntries).
               super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Cannot call DeleteEntry on empty ZipArchive object!","");
  std::logic_error::logic_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__logic_error_00189ae8;
  __cxa_throw(this_00,&ZipLogicError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DeleteEntry(const std::string& name) {

            if (!IsOpen()) throw ZipLogicError("Cannot call DeleteEntry on empty ZipArchive object!");

            m_ZipEntries
                    .erase(std::remove_if(m_ZipEntries.begin(), m_ZipEntries.end(), [&](const Impl::ZipEntry& entry) {
                        return name == entry.GetName();
                    }), m_ZipEntries.end());
        }